

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeResources(CodeGenerator *this,ostream *s,Class *clazz)

{
  pointer pRVar1;
  Resource *pRVar2;
  ostream *poVar3;
  pointer pRVar4;
  Resource *pRVar5;
  undefined1 local_98 [8];
  Resource i;
  
  poVar3 = std::operator<<(s,"    // resources");
  std::endl<char,std::char_traits<char>>(poVar3);
  pRVar1 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
           super__Vector_impl_data._M_finish;
  i.initializer.field_2._8_8_ = clazz;
  for (pRVar4 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    Resource::Resource((Resource *)local_98,pRVar4);
    poVar3 = std::operator<<(s,"    ");
    poVar3 = std::operator<<(poVar3,(string *)local_98);
    poVar3 = std::operator<<(poVar3," *");
    poVar3 = std::operator<<(poVar3,(string *)(i.type.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," = nullptr;");
    std::endl<char,std::char_traits<char>>(poVar3);
    Resource::~Resource((Resource *)local_98);
  }
  poVar3 = std::endl<char,std::char_traits<char>>(s);
  poVar3 = std::operator<<(poVar3,"    void initResources(rengine::ResourceManager *manager) {");
  std::endl<char,std::char_traits<char>>(poVar3);
  pRVar2 = *(Resource **)(i.initializer.field_2._8_8_ + 0xb0);
  for (pRVar5 = *(Resource **)(i.initializer.field_2._8_8_ + 0xa8); pRVar5 != pRVar2;
      pRVar5 = pRVar5 + 1) {
    Resource::Resource((Resource *)local_98,pRVar5);
    poVar3 = std::operator<<(s,"        ");
    poVar3 = std::operator<<(poVar3,(string *)(i.type.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," = manager->acquire<");
    poVar3 = std::operator<<(poVar3,(string *)local_98);
    poVar3 = std::operator<<(poVar3,">(\"");
    poVar3 = std::operator<<(poVar3,(string *)(i.name.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,"\");");
    std::endl<char,std::char_traits<char>>(poVar3);
    Resource::~Resource((Resource *)local_98);
  }
  poVar3 = std::operator<<(s,"    }");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void CodeGenerator::writeResources(std::ostream &s, Class *clazz)
{
    s << "    // resources" << std::endl;
    for (auto i : clazz->resources) {
        s << "    " << i.type << " *" << i.name << " = nullptr;" << std::endl;
    }
    s << std::endl
      << "    void initResources(rengine::ResourceManager *manager) {" << std::endl;
    for (auto i : clazz->resources) {
        s << "        " << i.name << " = manager->acquire<" << i.type << ">(\"" << i.initializer << "\");" << std::endl;
    }
    s << "    }" << std::endl
      << std::endl;
}